

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magnet_uri.cpp
# Opt level: O2

string * __thiscall
libtorrent::make_magnet_uri_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,torrent_info *info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  add_torrent_params *extraout_RDX;
  add_torrent_params *extraout_RDX_00;
  add_torrent_params *atp_00;
  add_torrent_params *extraout_RDX_01;
  announce_entry *tr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  web_seed_entry *s;
  add_torrent_params atp;
  
  add_torrent_params::add_torrent_params(&atp);
  atp.info_hashes.v2.m_number._M_elems[7] = *(uint *)(this + 0x260);
  atp.info_hashes.v1.m_number._M_elems._0_8_ = *(undefined8 *)(this + 0x230);
  atp.info_hashes.v1.m_number._M_elems._8_8_ = *(undefined8 *)(this + 0x238);
  atp.info_hashes._16_8_ = *(undefined8 *)(this + 0x240);
  atp.info_hashes.v2.m_number._M_elems._4_8_ = *(undefined8 *)(this + 0x248);
  atp.info_hashes.v2.m_number._M_elems._12_8_ = *(undefined8 *)(this + 0x250);
  atp.info_hashes.v2.m_number._M_elems._20_8_ = *(undefined8 *)(this + 600);
  ::std::__cxx11::string::_M_assign((string *)&atp.name);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&atp.trackers,(*(long *)(this + 200) - *(long *)(this + 0xc0)) / 0x60);
  pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 200);
  atp_00 = extraout_RDX;
  for (pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 0xc0)
      ; pbVar2 != pbVar1; pbVar2 = pbVar2 + 3) {
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&atp.trackers,
               pbVar2);
    atp_00 = extraout_RDX_00;
  }
  pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 0xe0);
  for (pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 0xd8)
      ; pbVar2 != pbVar1; pbVar2 = pbVar2 + 3) {
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&atp.url_seeds,
               pbVar2);
    atp_00 = extraout_RDX_01;
  }
  make_magnet_uri_abi_cxx11_(__return_storage_ptr__,(libtorrent *)&atp,atp_00);
  add_torrent_params::~add_torrent_params(&atp);
  return __return_storage_ptr__;
}

Assistant:

std::string make_magnet_uri(torrent_info const& info)
	{
		add_torrent_params atp;
		atp.info_hashes = info.info_hashes();
		atp.name = info.name();
		atp.trackers.reserve(info.internal_trackers().size());
		for (auto const& tr : info.internal_trackers())
			atp.trackers.emplace_back(tr.url);
		for (auto const& s : info.internal_web_seeds())
			atp.url_seeds.emplace_back(s.url);

		return make_magnet_uri(atp);
	}